

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

int BIO_write(BIO *b,void *data,int len)

{
  _func_595 *p_Var1;
  uint uVar2;
  int reason;
  int line;
  
  if (((b == (BIO *)0x0) || (b->method == (BIO_METHOD *)0x0)) ||
     (p_Var1 = b->method->bwrite, p_Var1 == (_func_595 *)0x0)) {
    reason = 0x73;
    line = 0x79;
  }
  else {
    if (*(int *)&b->cb_arg != 0) {
      if (len < 1) {
        return 0;
      }
      uVar2 = (*p_Var1)(b,(char *)data,len);
      if ((int)uVar2 < 1) {
        return uVar2;
      }
      b->prev_bio = (bio_st *)((long)&b->prev_bio->method + (ulong)uVar2);
      return uVar2;
    }
    reason = 0x72;
    line = 0x7d;
  }
  ERR_put_error(0x11,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                ,line);
  return -2;
}

Assistant:

int BIO_write(BIO *bio, const void *in, int inl) {
  if (bio == NULL || bio->method == NULL || bio->method->bwrite == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }
  if (!bio->init) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNINITIALIZED);
    return -2;
  }
  if (inl <= 0) {
    return 0;
  }
  int ret = bio->method->bwrite(bio, reinterpret_cast<const char *>(in), inl);
  if (ret > 0) {
    bio->num_write += ret;
  }
  return ret;
}